

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.cpp
# Opt level: O0

bool __thiscall Boolean::Decode(Boolean *this,uchar *pIn,size_t cbIn,size_t *cbUsed)

{
  bool bVar1;
  exception *this_00;
  uchar uVar2;
  size_t local_40;
  size_t cbPrefix;
  size_t size;
  size_t *cbUsed_local;
  size_t cbIn_local;
  uchar *pIn_local;
  Boolean *this_local;
  
  cbPrefix = 0;
  local_40 = 0;
  size = (size_t)cbUsed;
  cbUsed_local = (size_t *)cbIn;
  cbIn_local = (size_t)pIn;
  pIn_local = (uchar *)this;
  bVar1 = CheckDecode(pIn,cbIn,Boolean,&cbPrefix,&local_40);
  if (bVar1) {
    if (local_40 + cbPrefix != 3) {
      this_00 = (exception *)__cxa_allocate_exception(8);
      std::exception::exception(this_00);
      __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
    }
    uVar2 = '\0';
    if (*(char *)(cbIn_local + 2) != '\0') {
      uVar2 = 0xff;
    }
    this->b = uVar2;
    *(undefined8 *)size = 3;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = DerBase::DecodeNull((uchar *)cbIn_local,(size_t)cbUsed_local,(size_t *)size);
  }
  return this_local._7_1_;
}

Assistant:

bool Boolean::Decode(const unsigned char * pIn, size_t cbIn, size_t & cbUsed)
{
	size_t size = 0;
	size_t cbPrefix = 0;
	if (!CheckDecode(pIn, cbIn, DerType::Boolean, size, cbPrefix))
	{
		return DecodeNull(pIn, cbIn, cbUsed);
	}

	// Now check specifics for this type
	if (cbPrefix + size != 3)
		throw std::exception(); // Incorrect decode

	b = pIn[2] ? 0xff : 0;
	cbUsed = 3;
	return true;
}